

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_render_pass_creation_control
          (Impl *this,Value *state,VkRenderPassCreationControlEXT **out_info)

{
  uint uVar1;
  VkRenderPassCreationControlEXT *pVVar2;
  Type this_00;
  VkRenderPassCreationControlEXT *info;
  VkRenderPassCreationControlEXT **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkRenderPassCreationControlEXT>(&this->allocator);
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)state,"disallowMerging");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(this_00);
  pVVar2->disallowMerging = uVar1;
  *out_info = pVVar2;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_render_pass_creation_control(const Value &state, VkRenderPassCreationControlEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkRenderPassCreationControlEXT>();
	info->disallowMerging = state["disallowMerging"].GetUint();
	*out_info = info;
	return true;
}